

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O2

bool __thiscall
squall::TableBase::get<std::__cxx11::string>
          (TableBase *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r)

{
  SQRESULT SVar1;
  HSQOBJECT obj;
  
  obj._4_4_ = 0;
  obj._type = (this->tableobj_)._type;
  obj._unVal.pTable = (this->tableobj_)._unVal.pTable;
  sq_pushobject(this->vm_,obj);
  sq_pushstring(this->vm_,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar1 = sq_get(this->vm_,-2);
  if (-1 < SVar1) {
    detail::Fetch<squall::string_wrapper,_(squall::detail::FetchContext)2>::doit(this->vm_,-1);
    std::__cxx11::string::assign((char *)r);
    sq_pop(this->vm_,2);
  }
  return -1 < SVar1;
}

Assistant:

bool get(const string& name, T& r) {
        sq_pushobject(vm_, tableobj_);
        sq_pushstring(vm_, name.data(), name.length());
        if (!SQ_SUCCEEDED(sq_get(vm_, -2))) {
            return false;
        }
        r = detail::fetch<T, detail::FetchContext::TableEntry>(vm_, -1);
        sq_pop(vm_, 2);
        return true;
    }